

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::initTestDescriptor
          (TessellationShaderTessellationgl_TessCoord *this,_test_descriptor *test,
          _tessellation_shader_vertex_spacing vertex_spacing,
          _tessellation_primitive_mode primitive_mode,GLint n_patch_vertices,float *inner_tess_level
          ,float *outer_tess_level,_tessellation_test_type test_type)

{
  ulong uVar1;
  undefined8 uVar2;
  TessellationShaderTessellationgl_TessCoord *pTVar3;
  _test_descriptor *p_Var4;
  bool bVar5;
  int iVar6;
  GLuint GVar7;
  deUint32 dVar8;
  GLint GVar9;
  undefined4 extraout_var;
  TestError *pTVar11;
  undefined1 should_use_glInvocationID_indexed_input;
  ulong uVar12;
  undefined1 point_mode;
  bool bVar13;
  GLint link_status;
  GLint compile_status;
  char *te_body_raw_ptr;
  char *varyings [1];
  int local_88;
  int local_84;
  TessellationShaderTessellationgl_TessCoord *local_80;
  string local_78;
  GLfloat *local_58;
  GLfloat *local_50;
  _test_descriptor *local_48;
  pointer local_40;
  char *local_38;
  long lVar10;
  
  point_mode = SUB81(inner_tess_level,0);
  test->n_patch_vertices = n_patch_vertices;
  local_80 = (TessellationShaderTessellationgl_TessCoord *)CONCAT44(local_80._4_4_,primitive_mode);
  test->primitive_mode = primitive_mode;
  test->type = test_type;
  test->vertex_spacing = vertex_spacing;
  *(undefined8 *)test->tess_level_inner = *(undefined8 *)inner_tess_level;
  uVar2 = *(undefined8 *)(outer_tess_level + 2);
  *(undefined8 *)test->tess_level_outer = *(undefined8 *)outer_tess_level;
  *(undefined8 *)(test->tess_level_outer + 2) = uVar2;
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar6);
  GVar7 = (**(code **)(lVar10 + 0x3c8))();
  test->po_id = GVar7;
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x75d);
  if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
    GVar7 = (**(code **)(lVar10 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    test->tc_id = GVar7;
  }
  GVar7 = (**(code **)(lVar10 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  test->te_id = GVar7;
  dVar8 = (**(code **)(lVar10 + 0x800))();
  should_use_glInvocationID_indexed_input = 0x67;
  glu::checkError(dVar8,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x767);
  if (test->tc_id != 0) {
    TessellationShaderUtils::getGenericTCCode_abi_cxx11_
              (&local_78,(TessellationShaderUtils *)(ulong)(uint)n_patch_vertices,1,
               (bool)should_use_glInvocationID_indexed_input);
    local_40 = local_78._M_dataplus._M_p;
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,test->tc_id,1,&local_40);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"glShaderSource() failed for tessellation control shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  TessellationShaderUtils::getGenericTECode_abi_cxx11_
            (&local_78,(TessellationShaderUtils *)(ulong)vertex_spacing,
             (_tessellation_shader_vertex_spacing)local_80,TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST,
             TESSELLATION_SHADER_VERTEX_ORDERING_CCW,(bool)point_mode);
  local_40 = local_78._M_dataplus._M_p;
  local_80 = this;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,test->te_id,1,&local_40);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x778);
  local_50 = test->tess_level_inner;
  local_58 = test->tess_level_outer;
  local_84 = 0;
  uVar1._0_4_ = test->tc_id;
  uVar1._4_4_ = test->te_id;
  uVar12 = uVar1;
  bVar5 = true;
  local_48 = test;
  do {
    bVar13 = bVar5;
    if ((int)uVar12 != 0) {
      (**(code **)(lVar10 + 0x248))(uVar12 & 0xffffffff);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"glCompileShader() failed for tessellation shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x786);
      (**(code **)(lVar10 + 0xa70))(uVar12 & 0xffffffff,0x8b81,&local_84);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"glGetShaderiv() failed for tessellation shader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x789);
      if (local_84 != 1) {
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Tessellation shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x78d);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    p_Var4 = local_48;
    pTVar3 = local_80;
    uVar12 = uVar1 >> 0x20;
    bVar5 = false;
  } while (bVar13);
  (**(code **)(lVar10 + 0x10))(local_48->po_id,local_80->m_fs_id);
  (**(code **)(lVar10 + 0x10))(p_Var4->po_id,p_Var4->te_id);
  (**(code **)(lVar10 + 0x10))(p_Var4->po_id,pTVar3->m_vs_id);
  if (p_Var4->tc_id != 0) {
    (**(code **)(lVar10 + 0x10))(p_Var4->po_id);
  }
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x79c);
  local_38 = "result_uvw";
  (**(code **)(lVar10 + 0x14c8))(p_Var4->po_id,1,&local_38,0x8c8c);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7a3);
  local_88 = 0;
  (**(code **)(lVar10 + 0xce8))(p_Var4->po_id);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7a9);
  (**(code **)(lVar10 + 0x9d8))(p_Var4->po_id,0x8b82,&local_88);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x7ac);
  if (local_88 == 1) {
    if (p_Var4->type == TESSELLATION_TEST_TYPE_FIRST) {
      GVar9 = (**(code **)(lVar10 + 0xb48))(p_Var4->po_id,"inner_tess_level");
      p_Var4->inner_tess_level_uniform_location = GVar9;
      GVar9 = (**(code **)(lVar10 + 0xb48))(p_Var4->po_id,"outer_tess_level");
      p_Var4->outer_tess_level_uniform_location = GVar9;
      (**(code **)(lVar10 + 0x1680))(p_Var4->po_id);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"glUseProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7be);
      (**(code **)(lVar10 + 0x1528))(p_Var4->inner_tess_level_uniform_location,1,local_50);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"glUniform2fv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7c2);
      (**(code **)(lVar10 + 0x15a8))(p_Var4->outer_tess_level_uniform_location,1,local_58);
      dVar8 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar8,"glUniform4fv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x7c6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar11,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
             ,0x7b0);
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::initTestDescriptor(
	_test_descriptor& test, _tessellation_shader_vertex_spacing vertex_spacing,
	_tessellation_primitive_mode primitive_mode, glw::GLint n_patch_vertices, const float* inner_tess_level,
	const float* outer_tess_level, _tessellation_test_type test_type)
{
	test.n_patch_vertices = n_patch_vertices;
	test.primitive_mode   = primitive_mode;
	test.type			  = test_type;
	test.vertex_spacing   = vertex_spacing;

	memcpy(test.tess_level_inner, inner_tess_level, sizeof(float) * 2 /* components */);
	memcpy(test.tess_level_outer, outer_tess_level, sizeof(float) * 4 /* components */);

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	test.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up a pass-specific tessellation shader objects. */
	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		test.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	}

	test.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Configure tessellation control shader body */
	if (test.tc_id != 0)
	{
		std::string tc_body			= getTCCode(n_patch_vertices);
		const char* tc_body_raw_ptr = tc_body.c_str();

		shaderSourceSpecialized(test.tc_id, 1 /* count */, &tc_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");
	}

	/* Configure tessellation evaluation shader body */
	std::string te_body			= getTECode(vertex_spacing, primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	shaderSourceSpecialized(test.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the tessellation evaluation shader */
	glw::GLint		   compile_status = GL_FALSE;
	glw::GLuint		   shaders[]	  = { test.tc_id, test.te_id };
	const unsigned int n_shaders	  = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed for tessellation shader");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed for tessellation shader");

			if (compile_status != GL_TRUE)
			{
				TCU_FAIL("Tessellation shader compilation failed");
			}
		}
	} /* for (all shaders) */

	/* Attach all shader to the program object */
	gl.attachShader(test.po_id, m_fs_id);
	gl.attachShader(test.po_id, test.te_id);
	gl.attachShader(test.po_id, m_vs_id);

	if (test.tc_id != 0)
	{
		gl.attachShader(test.po_id, test.tc_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char*		   varyings[] = { "result_uvw" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(test.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(test.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(test.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* If TCS stage is present, set up the corresponding uniforms as needed */
	if (test.type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		test.inner_tess_level_uniform_location = gl.getUniformLocation(test.po_id, "inner_tess_level");
		test.outer_tess_level_uniform_location = gl.getUniformLocation(test.po_id, "outer_tess_level");

		DE_ASSERT(test.inner_tess_level_uniform_location != -1);
		DE_ASSERT(test.outer_tess_level_uniform_location != -1);

		/* Now that we have the locations, let's configure the uniforms */
		gl.useProgram(test.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

		gl.uniform2fv(test.inner_tess_level_uniform_location, 1, /* count */
					  test.tess_level_inner);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform2fv() call failed");

		gl.uniform4fv(test.outer_tess_level_uniform_location, 1, /* count */
					  test.tess_level_outer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed");
	}
}